

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_context.cpp
# Opt level: O2

void __thiscall ccs::BuildContext::addProperty(BuildContext *this,PropDef *propDef)

{
  uint propertyNumber;
  int iVar1;
  undefined4 extraout_var;
  Value value;
  undefined1 auStack_128 [104];
  Property local_c0;
  
  Value::Value((Value *)auStack_128,&propDef->value_);
  std::__cxx11::string::_M_assign((string *)(auStack_128 + 0x48));
  iVar1 = (*this->_vptr_BuildContext[2])(this);
  propertyNumber = this->dag_->nextProperty_;
  this->dag_->nextProperty_ = propertyNumber + 1;
  Property::Property(&local_c0,(Value *)auStack_128,&propDef->origin_,propertyNumber,
                     propDef->override_);
  Node::addProperty((Node *)CONCAT44(extraout_var,iVar1),&propDef->name_,&local_c0);
  Property::~Property(&local_c0);
  Value::~Value((Value *)auStack_128);
  return;
}

Assistant:

void BuildContext::addProperty(const ast::PropDef &propDef) {
  Value value(propDef.value_);
  value.setName(propDef.name_);
  node().addProperty(propDef.name_, Property(value,
      propDef.origin_, dag_.nextProperty(), propDef.override_));
}